

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O3

bool __thiscall Kernel::RobSubstitution::isUnbound(RobSubstitution *this,VarSpec v)

{
  Entry *pEVar1;
  bool bVar2;
  bool bVar3;
  VarSpec local_28;
  
  local_28._self = v._self._content;
  local_28.index = v.index;
  pEVar1 = Lib::DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::
           findEntry(&this->_bindings,&local_28);
  if (pEVar1 == (Entry *)0x0) {
    bVar2 = true;
  }
  else {
    do {
      local_28._self._content = (pEVar1->_val).term._content;
      bVar3 = (local_28._self._content & 3) == 0;
      bVar2 = !bVar3;
      if (bVar3) {
        return bVar2;
      }
      local_28.index = (pEVar1->_val).index;
      pEVar1 = Lib::DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::
               findEntry(&this->_bindings,&local_28);
    } while (pEVar1 != (Entry *)0x0);
  }
  return bVar2;
}

Assistant:

bool RobSubstitution::isUnbound(VarSpec v) const
{
  for(;;) {
    auto binding = _bindings.find(v);
    if(binding.isNone()) {
      return true;
    } else if(binding->isTerm()) {
      return false;
    }
    v = binding->varSpec();
  }
}